

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkg_genc.cpp
# Opt level: O1

void writeAssemblyCode(char *filename,char *destdir,char *optEntryPoint,char *optFilename,
                      char *outFilePath)

{
  byte bVar1;
  bool bVar2;
  uint32_t uVar3;
  uint uVar4;
  int iVar5;
  FileStream *fileStream;
  FileStream *fileStream_00;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  size_t sVar10;
  long lVar11;
  char cVar12;
  char *extraout_RDX;
  uint32_t *puVar13;
  uint uVar14;
  uint32_t *__s;
  char *__src;
  char *in_R9;
  long lVar15;
  ulong uVar16;
  char *pcVar17;
  char *pcVar18;
  char *__dest;
  byte bStack_10c5;
  uint local_10c4;
  char *local_10c0;
  char entry [64];
  char local_1078;
  char local_1077 [63];
  uint32_t buffer [1024];
  
  __s = (uint32_t *)0x3380b6;
  pcVar7 = optFilename;
  __src = outFilePath;
  fileStream = T_FileStream_open(filename,"rb");
  if (fileStream == (FileStream *)0x0) {
    writeAssemblyCode_cold_4();
  }
  else {
    __src = ".S";
    pcVar7 = entry;
    getOutFilename(filename,destdir,(char *)buffer,pcVar7,".S",optFilename);
    __s = (uint32_t *)0x2f345f;
    fileStream_00 = T_FileStream_open((char *)buffer,"w");
    in_R9 = optFilename;
    if (fileStream_00 != (FileStream *)0x0) {
      if (outFilePath != (char *)0x0) {
        strcpy(outFilePath,(char *)buffer);
      }
      if (optEntryPoint != (char *)0x0) {
        strcpy(entry,optEntryPoint);
        sVar6 = strlen(entry);
        builtin_strncpy(entry + sVar6,"_dat",5);
      }
      sVar6 = strlen(entry);
      if (sVar6 != 0) {
        sVar10 = 0;
        do {
          if ((byte)(entry[sVar10] - 0x2dU) < 2) {
            entry[sVar10] = '_';
          }
          sVar10 = sVar10 + 1;
        } while (sVar6 != sVar10);
      }
      local_10c0 = filename;
      sprintf((char *)buffer,assemblyHeader[assemblyHeaderIndex].header,entry,entry,entry,entry,
              entry,entry,entry,entry);
      T_FileStream_writeLine(fileStream_00,(char *)buffer);
      T_FileStream_writeLine(fileStream_00,assemblyHeader[assemblyHeaderIndex].beginLine);
      uVar14 = 0xffffffff;
LAB_001da095:
      uVar4 = T_FileStream_read(fileStream,buffer,0x1000);
      uVar16 = (ulong)(int)uVar4;
      if (uVar4 != 0x1000) {
        if (uVar4 == 0) goto LAB_001da20a;
        if ((uVar16 & 3) != 0) {
          memset(buffer + uVar16,0,(ulong)(uint)((int)(uVar16 & 3) << 2));
        }
      }
      if (3 < uVar4) {
        lVar15 = 0;
        do {
          uVar4 = buffer[lVar15];
          local_10c4 = uVar4;
          if (uVar14 == 0xffffffff) {
            pcVar7 = &local_1078;
LAB_001da15a:
            uVar14 = 1;
          }
          else {
            if (0x1f < uVar14) {
              local_1078 = '\n';
              strcpy(local_1077,assemblyHeader[assemblyHeaderIndex].beginLine);
              sVar6 = strlen(local_1077);
              pcVar7 = local_1077 + sVar6;
              goto LAB_001da15a;
            }
            local_1078 = ',';
            uVar14 = uVar14 + 1;
            pcVar7 = local_1077;
          }
          if (uVar4 < 10) {
            *pcVar7 = write32(_FileStream*,unsigned_int,unsigned_int)::hexToStr[uVar4];
            pcVar7 = pcVar7 + 1;
          }
          else {
            if (hexType == 1) {
              *pcVar7 = '0';
              pcVar7 = pcVar7 + 1;
            }
            else if (hexType == 0) {
              pcVar7[0] = '0';
              pcVar7[1] = 'x';
              pcVar7 = pcVar7 + 2;
            }
            bVar2 = false;
            lVar11 = 4;
            do {
              bVar1 = (&bStack_10c5)[lVar11];
              if ((bVar2) || (bVar1 != 0)) {
                *pcVar7 = write32(_FileStream*,unsigned_int,unsigned_int)::hexToStr[bVar1 >> 4];
                pcVar7[1] = write32(_FileStream*,unsigned_int,unsigned_int)::hexToStr[bVar1 & 0xf];
                pcVar7 = pcVar7 + 2;
                bVar2 = true;
              }
              else {
                bVar2 = false;
              }
              lVar11 = lVar11 + -1;
            } while (lVar11 != 0);
            if (hexType == 1) {
              *pcVar7 = 'h';
              pcVar7 = pcVar7 + 1;
            }
          }
          *pcVar7 = '\0';
          T_FileStream_writeLine(fileStream_00,&local_1078);
          lVar15 = lVar15 + 1;
        } while (lVar15 != (uVar16 >> 2) + (ulong)(uVar16 >> 2 == 0));
      }
      goto LAB_001da095;
    }
  }
  writeAssemblyCode_cold_3();
LAB_001da2b6:
  writeAssemblyCode_cold_1();
LAB_001da2c0:
  pcVar17 = local_10c0;
  writeAssemblyCode_cold_2();
  pcVar8 = findBasename(pcVar17);
  pcVar9 = strrchr(pcVar8,0x2e);
  if ((__s == (uint32_t *)0x0) || (__dest = extraout_RDX, (char)*__s == '\0')) {
    __dest = extraout_RDX;
    if (pcVar17 < pcVar8) {
      do {
        cVar12 = *pcVar17;
        pcVar17 = pcVar17 + 1;
        *__dest = cVar12;
        __dest = __dest + 1;
      } while (pcVar17 != pcVar8);
    }
  }
  else {
    do {
      pcVar18 = __dest;
      puVar13 = (uint32_t *)((long)__s + 1);
      uVar3 = *__s;
      *pcVar18 = (char)uVar3;
      __dest = pcVar18 + 1;
      __s = puVar13;
    } while (*(char *)puVar13 != '\0');
    pcVar17 = pcVar8;
    if ((char)uVar3 != '/') {
      *__dest = '/';
      __dest = pcVar18 + 2;
    }
  }
  if (pcVar9 == (char *)0x0) {
    strcpy(pcVar7,pcVar17);
    if (in_R9 == (char *)0x0) {
      in_R9 = pcVar17;
    }
  }
  else {
    pcVar8 = __dest;
    if (pcVar17 < pcVar9) {
      lVar15 = (long)pcVar9 - (long)pcVar17;
      do {
        cVar12 = *pcVar17;
        if (*pcVar17 == '-') {
          cVar12 = '_';
        }
        *pcVar7 = cVar12;
        *pcVar8 = cVar12;
        pcVar17 = pcVar17 + 1;
        pcVar8 = pcVar8 + 1;
        pcVar7 = pcVar7 + 1;
        lVar15 = lVar15 + -1;
      } while (lVar15 != 0);
    }
    *pcVar7 = '_';
    *pcVar8 = '_';
    pcVar8 = pcVar8 + 1;
    pcVar7 = pcVar7 + 1;
    cVar12 = pcVar17[1];
    if (cVar12 != '\0') {
      pcVar17 = pcVar17 + 2;
      do {
        *pcVar7 = cVar12;
        *pcVar8 = cVar12;
        pcVar8 = pcVar8 + 1;
        pcVar7 = pcVar7 + 1;
        cVar12 = *pcVar17;
        pcVar17 = pcVar17 + 1;
      } while (cVar12 != '\0');
    }
    *pcVar7 = '\0';
    if (in_R9 == (char *)0x0) {
      strcpy(pcVar8,__src);
      return;
    }
  }
  strcpy(__dest,in_R9);
  strcat(__dest,__src);
  return;
LAB_001da20a:
  T_FileStream_writeLine(fileStream_00,"\n");
  __s = buffer;
  pcVar7 = entry;
  __src = pcVar7;
  in_R9 = pcVar7;
  sprintf((char *)__s,assemblyHeader[assemblyHeaderIndex].footer,pcVar7);
  T_FileStream_writeLine(fileStream_00,(char *)__s);
  iVar5 = T_FileStream_error(fileStream);
  if (iVar5 == 0) {
    iVar5 = T_FileStream_error(fileStream_00);
    if (iVar5 == 0) {
      T_FileStream_close(fileStream_00);
      T_FileStream_close(fileStream);
      return;
    }
    goto LAB_001da2c0;
  }
  goto LAB_001da2b6;
}

Assistant:

U_CAPI void U_EXPORT2
writeAssemblyCode(const char *filename, const char *destdir, const char *optEntryPoint, const char *optFilename, char *outFilePath) {
    uint32_t column = MAX_COLUMN;
    char entry[64];
    uint32_t buffer[1024];
    char *bufferStr = (char *)buffer;
    FileStream *in, *out;
    size_t i, length;

    in=T_FileStream_open(filename, "rb");
    if(in==NULL) {
        fprintf(stderr, "genccode: unable to open input file %s\n", filename);
        exit(U_FILE_ACCESS_ERROR);
    }

    getOutFilename(filename, destdir, bufferStr, entry, ".S", optFilename);
    out=T_FileStream_open(bufferStr, "w");
    if(out==NULL) {
        fprintf(stderr, "genccode: unable to open output file %s\n", bufferStr);
        exit(U_FILE_ACCESS_ERROR);
    }

    if (outFilePath != NULL) {
        uprv_strcpy(outFilePath, bufferStr);
    }

#if defined (WINDOWS_WITH_GNUC) && U_PLATFORM != U_PF_CYGWIN
    /* Need to fix the file separator character when using MinGW. */
    swapFileSepChar(outFilePath, U_FILE_SEP_CHAR, '/');
#endif

    if(optEntryPoint != NULL) {
        uprv_strcpy(entry, optEntryPoint);
        uprv_strcat(entry, "_dat");
    }

    /* turn dashes or dots in the entry name into underscores */
    length=uprv_strlen(entry);
    for(i=0; i<length; ++i) {
        if(entry[i]=='-' || entry[i]=='.') {
            entry[i]='_';
        }
    }

    sprintf(bufferStr, assemblyHeader[assemblyHeaderIndex].header,
        entry, entry, entry, entry,
        entry, entry, entry, entry);
    T_FileStream_writeLine(out, bufferStr);
    T_FileStream_writeLine(out, assemblyHeader[assemblyHeaderIndex].beginLine);

    for(;;) {
        length=T_FileStream_read(in, buffer, sizeof(buffer));
        if(length==0) {
            break;
        }
        if (length != sizeof(buffer)) {
            /* pad with extra 0's when at the end of the file */
            for(i=0; i < (length % sizeof(uint32_t)); ++i) {
                buffer[length+i] = 0;
            }
        }
        for(i=0; i<(length/sizeof(buffer[0])); i++) {
            column = write32(out, buffer[i], column);
        }
    }

    T_FileStream_writeLine(out, "\n");

    sprintf(bufferStr, assemblyHeader[assemblyHeaderIndex].footer,
        entry, entry, entry, entry,
        entry, entry, entry, entry);
    T_FileStream_writeLine(out, bufferStr);

    if(T_FileStream_error(in)) {
        fprintf(stderr, "genccode: file read error while generating from file %s\n", filename);
        exit(U_FILE_ACCESS_ERROR);
    }

    if(T_FileStream_error(out)) {
        fprintf(stderr, "genccode: file write error while generating from file %s\n", filename);
        exit(U_FILE_ACCESS_ERROR);
    }

    T_FileStream_close(out);
    T_FileStream_close(in);
}